

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O2

CompoundString * __thiscall
Js::CompoundString::Builder<256U>::CreateCompoundString(Builder<256U> *this,bool reserveMoreSpace)

{
  CompoundString *pCVar1;
  
  pCVar1 = CompoundString::New(this->stringLength,this->directCharLength,this,this->charLength,
                               reserveMoreSpace,
                               (this->scriptContext->super_ScriptContextBase).javascriptLibrary);
  return pCVar1;
}

Assistant:

CompoundString *CompoundString::Builder<MinimumCharCapacity>::CreateCompoundString(const bool reserveMoreSpace) const
    {
        return
            CompoundString::New(
                stringLength,
                directCharLength,
                buffer,
                charLength,
                reserveMoreSpace,
                this->GetLibrary());
    }